

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressEnd_public
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ulong len;
  XXH64_hash_t XVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t err_code;
  size_t sVar5;
  size_t sVar6;
  xxh_u64 xVar7;
  undefined4 *puVar8;
  long lVar9;
  ulong uVar10;
  size_t err_code_1;
  undefined4 *dst_00;
  
  sVar5 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  if (cctx->stage == ZSTDcs_created) {
    sVar6 = 0xffffffffffffffc4;
  }
  else {
    dst_00 = (undefined4 *)((long)dst + sVar5);
    uVar10 = dstCapacity - sVar5;
    puVar8 = dst_00;
    if (cctx->stage == ZSTDcs_init) {
      src = (void *)0x0;
      sVar6 = ZSTD_writeFrameHeader(dst_00,uVar10,&cctx->appliedParams,0,0);
      if (0xffffffffffffff88 < sVar6) goto LAB_00185df1;
      uVar10 = uVar10 - sVar6;
      cctx->stage = ZSTDcs_ongoing;
      puVar8 = (undefined4 *)(sVar6 + (long)dst_00);
    }
    if (cctx->stage != ZSTDcs_ending) {
      if (uVar10 < 4) {
        sVar6 = 0xffffffffffffffba;
        goto LAB_00185df1;
      }
      *puVar8 = 1;
      puVar8 = (undefined4 *)((long)puVar8 + 3);
      uVar10 = uVar10 - 3;
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      len = (cctx->xxhState).total_len;
      if (len < 0x20) {
        lVar9 = (cctx->xxhState).v[2] + 0x27d4eb2f165667c5;
      }
      else {
        XVar1 = (cctx->xxhState).v[0];
        uVar2 = (cctx->xxhState).v[1];
        uVar3 = (cctx->xxhState).v[2];
        uVar4 = (cctx->xxhState).v[3];
        src = (void *)(((uVar2 * -0x6c158a5880000000 | uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
                        -0x61c8864e7a143579 ^
                       ((XVar1 * -0x6c158a5880000000 | XVar1 * -0x3d4d51c2d82b14b1 >> 0x21) *
                        -0x61c8864e7a143579 ^
                       (uVar4 << 0x12 | uVar4 >> 0x2e) + (uVar3 << 0xc | uVar3 >> 0x34) +
                       (uVar2 << 7 | uVar2 >> 0x39) + (XVar1 << 1 | (ulong)((long)XVar1 < 0))) *
                       -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                      -0x7a1435883d4d519d);
        lVar9 = ((uVar4 * -0x6c158a5880000000 | uVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
                 -0x61c8864e7a143579 ^
                ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
                 -0x61c8864e7a143579 ^ (ulong)src) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
                -0x61c8864e7a143579 + -0x7a1435883d4d519d;
      }
      xVar7 = XXH64_finalize(lVar9 + len,(xxh_u8 *)(cctx->xxhState).mem64,len,(XXH_alignment)src);
      if (uVar10 < 4) {
        sVar6 = 0xffffffffffffffba;
        goto LAB_00185df1;
      }
      *puVar8 = (int)xVar7;
      puVar8 = puVar8 + 1;
    }
    cctx->stage = ZSTDcs_created;
    sVar6 = (long)puVar8 - (long)dst_00;
  }
LAB_00185df1:
  uVar10 = sVar6;
  if (sVar6 < 0xffffffffffffff89) {
    if (((cctx->appliedParams).fParams.contentSizeFlag != 0) && (cctx->pledgedSrcSizePlusOne == 0))
    {
      __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x64f5,
                    "size_t ZSTD_compressEnd_public(ZSTD_CCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if ((cctx->pledgedSrcSizePlusOne == 0) ||
       (uVar10 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)) {
      uVar10 = sVar6 + sVar5;
    }
  }
  return uVar10;
}

Assistant:

size_t ZSTD_compressEnd_public(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}